

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# labeling_fchang_2003.h
# Opt level: O1

void __thiscall
CT::MemContourTracing
          (CT *this,MemMat<unsigned_char> *img,MemMat<int> *img_labels,int x,int y,int i_label,
          bool b_external)

{
  int *piVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  bool b_isolated;
  Point2i crd_cur_point;
  int i_previous_contour_point;
  Point2i s;
  int local_4c [2];
  undefined1 local_44 [8];
  uint local_3c;
  int local_38;
  int local_34;
  
  local_4c[0] = 0;
  local_4c[1] = 0;
  piVar1 = (int *)(**(long **)&(img_labels->accesses_).field_0x48 * (long)y +
                   *(long *)&(img_labels->accesses_).field_0x10 + (long)x * 4);
  *piVar1 = *piVar1 + 1;
  *(int *)((long)y * **(long **)&(img_labels->img_).field_0x48 +
           *(long *)&(img_labels->img_).field_0x10 + (long)x * 4) = i_label;
  local_3c = b_external ^ 7;
  local_38 = x;
  local_34 = y;
  MemTracer((CT *)local_44,(MemMat<unsigned_char> *)this,(MemMat<int> *)img,(Point2i *)img_labels,
            &local_38,(bool *)&local_3c);
  uVar3 = local_44._4_4_;
  uVar2 = local_44._0_4_;
  do {
    do {
      piVar1 = (int *)(**(long **)&(img_labels->accesses_).field_0x48 * (long)(int)local_44._4_4_ +
                       *(long *)&(img_labels->accesses_).field_0x10 + (long)(int)local_44._0_4_ * 4)
      ;
      *piVar1 = *piVar1 + 1;
      *(int *)((long)(int)local_44._4_4_ * **(long **)&(img_labels->img_).field_0x48 +
               *(long *)&(img_labels->img_).field_0x10 + (long)(int)local_44._0_4_ * 4) = i_label;
      local_4c[0] = local_44._0_4_;
      local_4c[1] = local_44._4_4_;
      MemTracer((CT *)local_44,(MemMat<unsigned_char> *)this,(MemMat<int> *)img,
                (Point2i *)img_labels,local_4c,(bool *)&local_3c);
    } while (local_4c[0] != local_38);
  } while ((local_4c[1] != local_34) || (local_44._4_4_ != uVar3 || local_44._0_4_ != uVar2));
  return;
}

Assistant:

void MemContourTracing(MemMat<unsigned char> &img, MemMat<int> &img_labels, int x, int y, int i_label, bool b_external) {
        cv::Point2i s(x, y), T, crd_next_point, crd_cur_point;

        // The current point is labeled 
        img_labels(s.y, s.x) = i_label;

        bool b_isolated(false);
        int i_previous_contour_point;
        if (b_external)
            i_previous_contour_point = 6;
        else
            i_previous_contour_point = 7;

        // First call to Tracer
        crd_next_point = T = MemTracer(img, img_labels, s, i_previous_contour_point, b_isolated);
        if (b_isolated)
            return;

        do {
            crd_cur_point = crd_next_point;
            img_labels(crd_cur_point.y, crd_cur_point.x) = i_label;
            crd_next_point = MemTracer(img, img_labels, crd_cur_point, i_previous_contour_point, b_isolated);
        } while (!(crd_cur_point == s && crd_next_point == T));
    }